

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

Smf * rlib::midi::Smf::convertTimebase(Smf *smf,int timeBase)

{
  uint64_t uVar1;
  bool bVar2;
  reference pEVar3;
  int in_EDX;
  int *in_RSI;
  Smf *in_RDI;
  undefined1 auVar4 [16];
  uint64_t dstPos;
  Event *event;
  iterator __end2;
  iterator __begin2;
  Events *__range2;
  Track dstTrack;
  Track *track;
  const_iterator __end1;
  const_iterator __begin1;
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *__range1;
  double mul;
  Smf *dst;
  iterator in_stack_ffffffffffffff38;
  Smf *this;
  iterator in_stack_ffffffffffffff50;
  _Self local_88;
  _Self local_80;
  reference local_78;
  reference local_40;
  _Self local_38;
  _Self local_30;
  int *local_28;
  double local_20;
  undefined1 local_15;
  int local_14;
  int *local_10;
  
  local_15 = 0;
  this = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  Smf((Smf *)0x1e0ac8);
  this->timeBase = local_14;
  local_20 = (double)this->timeBase / (double)*local_10;
  local_28 = local_10 + 2;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::begin
                 ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
                  in_stack_ffffffffffffff38._M_node);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::end
                 ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
                  in_stack_ffffffffffffff38._M_node);
  while (bVar2 = std::operator!=(&local_30,&local_38), bVar2) {
    local_40 = std::_List_const_iterator<rlib::midi::Smf::Track>::operator*
                         ((_List_const_iterator<rlib::midi::Smf::Track> *)in_RDI);
    Track::Track((Track *)0x1e0b6e);
    local_78 = local_40;
    local_80._M_node =
         (_Base_ptr)
         std::
         multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
         ::begin(in_stack_ffffffffffffff38._M_node);
    local_88._M_node =
         (_Base_ptr)
         std::
         multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
         ::end(in_stack_ffffffffffffff38._M_node);
    while (bVar2 = std::operator!=(&local_80,&local_88), bVar2) {
      pEVar3 = std::_Rb_tree_const_iterator<rlib::midi::Smf::Event>::operator*
                         ((_Rb_tree_const_iterator<rlib::midi::Smf::Event> *)in_RDI);
      uVar1 = pEVar3->position;
      auVar4._8_4_ = (int)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._12_4_ = 0x45300000;
      round(((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * local_20);
      in_stack_ffffffffffffff38 =
           std::
           multiset<rlib::midi::Smf::Event,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
           ::emplace<unsigned_long_const&,std::shared_ptr<rlib::midi::Event_const>const&>
                     ((multiset<rlib::midi::Smf::Event,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                       *)this,(unsigned_long *)in_RDI,in_stack_ffffffffffffff38._M_node);
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff38;
      std::_Rb_tree_const_iterator<rlib::midi::Smf::Event>::operator++
                ((_Rb_tree_const_iterator<rlib::midi::Smf::Event> *)in_RDI);
    }
    std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::push_back
              ((list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
               in_stack_ffffffffffffff50._M_node,(value_type *)this);
    Track::~Track((Track *)0x1e0ca1);
    std::_List_const_iterator<rlib::midi::Smf::Track>::operator++(&local_30);
  }
  return in_RDI;
}

Assistant:

Smf Smf::convertTimebase(const Smf& smf, int timeBase) {
	Smf dst;
	dst.timeBase = timeBase;
	const auto mul = static_cast<double>(dst.timeBase) / smf.timeBase;
	for (auto& track : smf.tracks) {
		Track dstTrack;
		for (auto& event : track.events) {
			const auto dstPos = static_cast<decltype(Event::position)>(std::round(event.position * mul));
			dstTrack.events.emplace(dstPos, event.event);
		}
		dst.tracks.push_back(dstTrack);
	}
	return dst;
}